

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldState.cpp
# Opt level: O1

void __thiscall AI::WorldState::pushChanges(WorldState *this,Task *task)

{
  _Base_ptr p_Var1;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  *this_00;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  *this_01;
  _Base_ptr p_Var2;
  mapped_type_conflict mVar3;
  mapped_type mVar4;
  float fVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  mapped_type_conflict *pmVar9;
  mapped_type_conflict *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Rb_tree_header *p_Var13;
  StateChanges changed;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  copiedVectors;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  copiedValues;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  copiedFlags;
  StateChanges local_180;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  local_c0;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  local_90;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  local_60;
  
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::_Rb_tree(&local_60,&(task->modifiedFlags)._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::_Rb_tree(&local_90,&(task->modifiedValues)._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::_Rb_tree(&local_c0,&(task->modifiedVectors)._M_t);
  p_Var8 = (task->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(task->modifiedFlags)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var13) {
    do {
      pmVar6 = std::
               map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
               ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                             *)&local_60,&p_Var8[1]._M_color);
      pmVar7 = std::
               map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
               ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                             *)this,&p_Var8[1]._M_color);
      mVar4 = *pmVar6;
      *pmVar6 = *pmVar7;
      *pmVar7 = mVar4;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var13);
  }
  p_Var8 = (task->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(task->modifiedValues)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var13) {
    do {
      pmVar9 = std::
               map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
               ::operator[]((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                             *)&local_90,&p_Var8[1]._M_color);
      pmVar10 = std::
                map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                ::operator[](&(this->current).values,&p_Var8[1]._M_color);
      mVar3 = *pmVar9;
      *pmVar9 = *pmVar10;
      *pmVar10 = mVar3;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var13);
  }
  p_Var8 = (task->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(task->modifiedVectors)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var13) {
    do {
      pmVar11 = std::
                map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
                ::operator[]((map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
                              *)&local_c0,&p_Var8[1]._M_color);
      pmVar12 = std::
                map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
                ::operator[](&(this->current).vectors,&p_Var8[1]._M_color);
      local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)pmVar11->z;
      local_180.state.flags._M_t._M_impl._0_4_ = pmVar11->x;
      local_180.state.flags._M_t._M_impl._4_4_ = pmVar11->y;
      pmVar11->z = pmVar12->z;
      fVar5 = pmVar12->y;
      pmVar11->x = pmVar12->x;
      pmVar11->y = fVar5;
      pmVar12->z = (float)local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_color;
      pmVar12->x = (float)local_180.state.flags._M_t._M_impl._0_4_;
      pmVar12->y = (float)local_180.state.flags._M_t._M_impl._4_4_;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var13);
  }
  p_Var8 = &local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
  local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var8;
  local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
  local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
  local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180.valuesAddedOrRemoved._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::clear((_Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           *)&local_180);
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var13 = &local_60._M_impl.super__Rb_tree_header;
    local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var8;
    local_180.state.flags._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
  }
  this_00 = &local_180.state.values;
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::clear(&this_00->_M_t);
  if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var13 = &local_90._M_impl.super__Rb_tree_header;
    local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_90._M_impl.super__Rb_tree_header._M_header._M_color;
    local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var1;
    local_180.state.values._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_90._M_impl.super__Rb_tree_header._M_node_count;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
  }
  this_01 = &local_180.state.vectors;
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::clear(&this_01->_M_t);
  if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var13 = &local_c0._M_impl.super__Rb_tree_header;
    local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var2;
    local_180.state.vectors._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_c0._M_impl.super__Rb_tree_header._M_node_count;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
  }
  std::vector<AI::StateChanges,std::allocator<AI::StateChanges>>::emplace_back<AI::StateChanges&>
            ((vector<AI::StateChanges,std::allocator<AI::StateChanges>> *)&this->changes,&local_180)
  ;
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~_Rb_tree(&local_180.valuesAddedOrRemoved._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::~_Rb_tree(&this_01->_M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::~_Rb_tree(&this_00->_M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
               *)&local_180);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void WorldState::pushChanges(Task& task)
	{
		auto copiedFlags = task.modifiedFlags;
		auto copiedValues = task.modifiedValues;
		auto copiedVectors = task.modifiedVectors;

		for (auto& flag : task.modifiedFlags)
		{			
			std::swap(copiedFlags[flag.first], current.flags[flag.first]);
		}

		for (auto& value : task.modifiedValues)
		{			
			std::swap(copiedValues[value.first], current.values[value.first]);
		}

		for (auto& vector : task.modifiedVectors)
		{
			std::swap(copiedVectors[vector.first], current.vectors[vector.first]);
		}

		StateChanges changed;
		changed.state.flags = std::move(copiedFlags);
		changed.state.values = std::move(copiedValues);
		changed.state.vectors = std::move(copiedVectors);

		changes.emplace_back(changed);
	}